

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::export_to_file(NaVector *this,char *szFilePath)

{
  uint uVar1;
  FILE *__stream;
  undefined4 *puVar2;
  uint uVar3;
  
  if (szFilePath == (char *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
  }
  else {
    __stream = fopen(szFilePath,"wt");
    if (__stream != (FILE *)0x0) {
      uVar1 = (*this->_vptr_NaVector[6])(this);
      uVar3 = 0;
      fprintf(__stream,"%u\n",(ulong)uVar1);
      while( true ) {
        uVar1 = (*this->_vptr_NaVector[6])(this);
        if (uVar1 <= uVar3) break;
        (*this->_vptr_NaVector[9])(this,(ulong)uVar3);
        fprintf(__stream,"%g\n");
        uVar3 = uVar3 + 1;
      }
      fclose(__stream);
      return;
    }
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 5;
  }
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::export_to_file (const char* szFilePath) const
{
    if(NULL == szFilePath)
        throw(na_null_pointer);

    FILE    *fp = fopen(szFilePath, "wt");
    if(NULL == fp)
        throw(na_cant_open_file);

    fprintf(fp, "%u\n", dim());

    unsigned    i;
    for(i = 0; i < dim(); ++i){
         fprintf(fp, "%g\n", get(i));
    }

    fclose(fp);
}